

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O1

uint64_t aom_sum_squares_2d_i16_avx2(int16_t *src,int stride,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  uint64_t uVar4;
  undefined1 (*pauVar5) [32];
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  
  if ((width == 4) && (height == 4)) {
    auVar8._8_8_ = *(undefined8 *)(src + stride);
    auVar8._0_8_ = *(undefined8 *)src;
    auVar10._8_8_ = *(undefined8 *)(src + stride * 3);
    auVar10._0_8_ = *(undefined8 *)(src + stride * 2);
    auVar8 = pmaddwd(auVar8,auVar8);
    auVar10 = pmaddwd(auVar10,auVar10);
    return (long)(auVar10._12_4_ + auVar8._12_4_ + auVar10._8_4_ + auVar8._8_4_ +
                 auVar10._4_4_ + auVar8._4_4_ + auVar10._0_4_ + auVar8._0_4_);
  }
  uVar3 = height & 3;
  if ((width == 4) && (uVar3 == 0)) {
    uVar4 = aom_sum_squares_2d_i16_4xn_sse2(src,stride,height);
    return uVar4;
  }
  if ((width == 8) && (uVar3 == 0)) {
    uVar4 = aom_sum_squares_2d_i16_nxn_sse2(src,stride,8,height);
    return uVar4;
  }
  if (uVar3 != 0 || (width & 0xfU) != 0) {
    uVar4 = aom_sum_squares_2d_i16_c(src,stride,width,height);
    return uVar4;
  }
  if (height < 1) {
    auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    iVar6 = 0;
    auVar9 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      auVar11 = auVar12._0_32_;
      if (0 < width) {
        lVar7 = 0;
        pauVar5 = (undefined1 (*) [32])src;
        do {
          auVar11 = vpmaddwd_avx2(*pauVar5,*pauVar5);
          auVar11 = vpaddd_avx2(auVar11,auVar12._0_32_);
          auVar1 = vpmaddwd_avx2(*(undefined1 (*) [32])(*pauVar5 + (long)stride * 2),
                                 *(undefined1 (*) [32])(*pauVar5 + (long)stride * 2));
          auVar2 = vpmaddwd_avx2(*(undefined1 (*) [32])(*pauVar5 + (long)(stride * 2) * 2),
                                 *(undefined1 (*) [32])(*pauVar5 + (long)(stride * 2) * 2));
          auVar1 = vpaddd_avx2(auVar1,auVar2);
          auVar11 = vpaddd_avx2(auVar11,auVar1);
          auVar1 = vpmaddwd_avx2(*(undefined1 (*) [32])(*pauVar5 + (long)(stride * 3) * 2),
                                 *(undefined1 (*) [32])(*pauVar5 + (long)(stride * 3) * 2));
          auVar11 = vpaddd_avx2(auVar11,auVar1);
          auVar12 = ZEXT3264(auVar11);
          lVar7 = lVar7 + 0x10;
          pauVar5 = pauVar5 + 1;
        } while (lVar7 < width);
      }
      auVar1 = vpblendd_avx2(auVar11,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
      auVar1 = vpaddq_avx2(auVar1,auVar9._0_32_);
      auVar11 = vpsrlq_avx2(auVar11,0x20);
      auVar11 = vpaddq_avx2(auVar1,auVar11);
      auVar9 = ZEXT3264(auVar11);
      iVar6 = iVar6 + 4;
      src = (int16_t *)(*(undefined1 (*) [32])src + (long)(stride * 4) * 2);
    } while (iVar6 < height);
  }
  auVar8 = vpaddq_avx(auVar11._0_16_,auVar11._16_16_);
  auVar10 = vpshufd_avx(auVar8,0xee);
  auVar8 = vpaddq_avx(auVar10,auVar8);
  return auVar8._0_8_;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_avx2(const int16_t *src, int stride, int width,
                                     int height) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_squares_2d_i16_4x4_sse2(src, stride);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_squares_2d_i16_4xn_sse2(src, stride, height);
  } else if (LIKELY(width == 8 && (height & 3) == 0)) {
    return aom_sum_squares_2d_i16_nxn_sse2(src, stride, width, height);
  } else if (LIKELY(((width & 15) == 0) && ((height & 3) == 0))) {
    return aom_sum_squares_2d_i16_nxn_avx2(src, stride, width, height);
  } else {
    return aom_sum_squares_2d_i16_c(src, stride, width, height);
  }
}